

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O2

errr grab_name(char *from,char *what,char **list,int max,int *num)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)max;
  if (max < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      msg("Unknown %s \'%s\'.",from,what);
      return 4;
    }
    iVar1 = strcmp(what,list[uVar2]);
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
  }
  *num = (int)uVar2;
  return 0;
}

Assistant:

errr grab_name(const char *from, const char *what, const char *list[], int max,
			   int *num)
{
	int i;

	/* Scan list */
	for (i = 0; i < max; i++) {
		if (streq(what, list[i])) {
			*num = i;
			return PARSE_ERROR_NONE;
		}
	}

	/* Oops */
	msg("Unknown %s '%s'.", from, what);

	/* Error */
	return PARSE_ERROR_GENERIC;
}